

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keypoint_approach.cpp
# Opt level: O1

pair<std::vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>,_cv::Mat> *
keypoint_compute(pair<std::vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>,_cv::Mat>
                 *__return_storage_ptr__,Mat *img,ORB_Param *param)

{
  undefined8 uVar1;
  Ptr<cv::ORB> orb;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_d0;
  vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_> keypoint;
  undefined4 local_b0 [2];
  Mat *local_a8;
  undefined8 local_a0;
  undefined4 local_98 [2];
  Mat *local_90;
  undefined8 uStack_88;
  Mat descriptor;
  
  cv::ORB::create(0x3f99999a,&orb,500,8,0x1f,0,2,0,0x1f,0x14);
  (**(code **)(*_orb + 0x80))(_orb,param->nfeature);
  (**(code **)(*_orb + 0xb0))(_orb,param->edgeThreshold);
  (**(code **)(*_orb + 0xa0))(_orb,param->nlevels);
  (**(code **)(*_orb + 0x100))(_orb,param->fastThreshold);
  (**(code **)(*_orb + 0xf0))(_orb,param->patchSize);
  (**(code **)(*_orb + 0xd0))(_orb,param->WTA_K);
  keypoint.super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  keypoint.super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  keypoint.super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>::reserve(&keypoint,(long)param->nfeature)
  ;
  cv::Mat::Mat(&descriptor);
  local_a0 = 0;
  local_b0[0] = 0x1010000;
  local_a8 = img;
  uVar1 = cv::noArray();
  uStack_88 = 0;
  local_98[0] = 0x2010000;
  local_90 = &descriptor;
  (**(code **)(*_orb + 0x60))(_orb,local_b0,uVar1,&keypoint,local_98,0);
  std::pair<std::vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>,_cv::Mat>::
  pair<std::vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>,_cv::Mat,_true>
            (__return_storage_ptr__,&keypoint,&descriptor);
  cv::Mat::~Mat(&descriptor);
  if (keypoint.super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(keypoint.super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)keypoint.super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)keypoint.super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_d0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_d0);
  }
  return __return_storage_ptr__;
}

Assistant:

std::pair<std::vector<cv::KeyPoint>, cv::Mat> keypoint_compute(const cv::Mat& img, const ORB_Param& param)
{
#if CV_MAJOR_VERSION < 3
    auto orb = std::make_unique<cv::ORB>(param.nfeature, 1.2f, param.nlevels, param.edgeThreshold, 0, param.WTA_K,
        cv::ORB::HARRIS_SCORE, param.patchSize);
#else
    auto orb = cv::ORB::create();

    orb->setMaxFeatures(param.nfeature);
    orb->setEdgeThreshold(param.edgeThreshold);
    orb->setNLevels(param.nlevels);
    orb->setFastThreshold(param.fastThreshold);
    orb->setPatchSize(param.patchSize);
    orb->setWTA_K(param.WTA_K);
#endif

    std::vector<cv::KeyPoint> keypoint;
    keypoint.reserve(param.nfeature);
    cv::Mat descriptor;
#if CV_MAJOR_VERSION < 3
    orb->detect(img, keypoint);
    orb->compute(img, keypoint, descriptor);
#else
    orb->detectAndCompute(img, cv::noArray(), keypoint, descriptor, false);
#endif
    return {std::move(keypoint), std::move(descriptor)};
}